

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportParams.H
# Opt level: O2

void __thiscall
pele::physics::transport::TransportParams<pele::physics::transport::SimpleTransport>::sync_to_device
          (TransportParams<pele::physics::transport::SimpleTransport> *this)

{
  if (this->m_device_allocated != false) {
    memcpy(this->m_d_trans_parm,this,0x4150);
    return;
  }
  amrex::Abort_host("Device params not allocated yet");
  return;
}

Assistant:

void sync_to_device()
  {
    if (!m_device_allocated) {
      amrex::Abort("Device params not allocated yet");
    } else {
      amrex::Gpu::copy(
        amrex::Gpu::hostToDevice, &m_h_trans_parm, &m_h_trans_parm + 1,
        m_d_trans_parm);
    }
  }